

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void getKktFailures(HighsOptions *options,HighsLp *lp,
                   vector<double,_std::allocator<double>_> *gradient,HighsSolution *solution,
                   HighsBasis *basis,HighsInfo *highs_info,HighsPrimalDualErrors *primal_dual_errors
                   ,bool get_residuals)

{
  double dVar1;
  double dVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  HighsSolution *pHVar9;
  HighsInfo *pHVar10;
  bool bVar11;
  double *pdVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  HighsBasisStatus *status_pointer;
  char *pcVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  double *pdVar19;
  char cVar20;
  double *pdVar21;
  double *pdVar22;
  ulong uVar23;
  HighsInt *pHVar24;
  double *pdVar25;
  double *pdVar26;
  HighsInt iCol;
  long lVar27;
  double *pdVar28;
  HighsError *pHVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  double *pdVar33;
  double dVar34;
  pointer pdVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  HighsBasisStatus status;
  HighsSolution *local_200;
  uint local_1f4;
  HighsBasis *local_1f0;
  undefined4 local_1e4;
  double *local_1e0;
  pointer local_1d8;
  HighsError *local_1d0;
  HighsInt *local_1c8;
  double local_1c0;
  double local_1b8;
  HighsInfo *local_1b0;
  pointer local_1a8;
  double absolute_primal_infeasibility;
  double *local_198;
  HighsInt *local_190;
  HighsInt *local_188;
  double *local_180;
  double *local_178;
  HighsInt *local_170;
  double *local_168;
  double *local_160;
  HighsInt *local_158;
  double *local_150;
  double *local_148;
  HighsOptions *local_140;
  double local_138;
  double *local_130;
  double value_residual;
  double dual_infeasibility;
  vector<double,_std::allocator<double>_> dual_negative_sum;
  vector<double,_std::allocator<double>_> dual_positive_sum;
  vector<double,_std::allocator<double>_> primal_negative_sum;
  vector<double,_std::allocator<double>_> primal_positive_sum;
  double relative_primal_infeasibility;
  double check_sum_complementarity_violations;
  double check_max_complementarity_violation;
  
  local_1c0 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_138 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  local_130 = &(highs_info->super_HighsInfoStruct).max_primal_infeasibility;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_primal_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).relative_index = -1;
  local_1e0 = &(highs_info->super_HighsInfoStruct).max_dual_infeasibility;
  (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_dual_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).relative_index = -1;
  (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  (highs_info->super_HighsInfoStruct).max_complementarity_violation = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_complementarity_violations = INFINITY;
  pHVar3 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pHVar4 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar11 = solution->value_valid;
  if (bVar11 == false) {
    local_1f4 = (uint)CONCAT71((int7)((ulong)highs_info >> 8),get_residuals) ^ 1;
    bVar13 = solution->dual_valid;
LAB_0026edcf:
    primal_dual_errors->num_primal_residual = -1;
    primal_dual_errors->sum_primal_residual = INFINITY;
    (primal_dual_errors->max_primal_residual).absolute_value = INFINITY;
    (primal_dual_errors->max_primal_residual).absolute_index = -1;
    (primal_dual_errors->max_primal_residual).relative_value = INFINITY;
    (primal_dual_errors->max_primal_residual).relative_index = -1;
  }
  else {
    (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
    *local_130 = 0.0;
    (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_index = 0;
    (primal_dual_errors->max_primal_infeasibility).relative_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).relative_index = 0;
    bVar13 = solution->dual_valid;
    if ((bool)bVar13 == true) {
      (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
      *local_1e0 = 0.0;
      (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_index = 0;
      (primal_dual_errors->max_dual_infeasibility).relative_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).relative_index = 0;
    }
    if (!get_residuals) {
      local_1f4 = (uint)CONCAT71((int7)((ulong)&primal_dual_errors->sum_off_bound_nonbasic >> 8),1);
      goto LAB_0026edcf;
    }
    primal_dual_errors->num_primal_residual = 0;
    primal_dual_errors->sum_primal_residual = 0.0;
    (primal_dual_errors->max_primal_residual).absolute_value = 0.0;
    (primal_dual_errors->max_primal_residual).absolute_index = 0;
    (primal_dual_errors->max_primal_residual).relative_value = 0.0;
    (primal_dual_errors->max_primal_residual).relative_index = 0;
    local_1f4 = 0;
  }
  local_148 = &(primal_dual_errors->max_primal_residual).relative_value;
  local_150 = &primal_dual_errors->sum_dual_residual;
  local_158 = &primal_dual_errors->num_off_bound_nonbasic;
  local_160 = &primal_dual_errors->max_off_bound_nonbasic;
  local_168 = &primal_dual_errors->sum_off_bound_nonbasic;
  local_170 = &primal_dual_errors->num_large_nonzero_basic_duals;
  local_178 = &primal_dual_errors->max_nonzero_basic_dual;
  local_180 = &primal_dual_errors->sum_nonzero_basic_duals;
  local_188 = &(primal_dual_errors->max_dual_residual).absolute_index;
  local_190 = &(primal_dual_errors->max_dual_residual).relative_index;
  local_198 = &(primal_dual_errors->max_dual_residual).relative_value;
  local_1c8 = &primal_dual_errors->num_primal_residual;
  local_1d0 = &primal_dual_errors->max_primal_residual;
  pHVar29 = &primal_dual_errors->max_dual_residual;
  bVar13 = bVar13 ^ 1 | (byte)local_1f4;
  iVar14 = -(bVar13 & 1);
  dVar34 = 0.0;
  dVar36 = INFINITY;
  if ((bVar13 & 1) == 0) {
    dVar36 = 0.0;
  }
  primal_dual_errors->num_dual_residual = iVar14;
  primal_dual_errors->sum_dual_residual = dVar36;
  (primal_dual_errors->max_dual_residual).absolute_value = dVar36;
  (primal_dual_errors->max_dual_residual).absolute_index = iVar14;
  (primal_dual_errors->max_dual_residual).relative_value = dVar36;
  (primal_dual_errors->max_dual_residual).relative_index = iVar14;
  iVar14 = basis->valid - 1;
  if (basis->valid == false) {
    dVar34 = INFINITY;
  }
  primal_dual_errors->num_nonzero_basic_duals = iVar14;
  primal_dual_errors->num_large_nonzero_basic_duals = iVar14;
  primal_dual_errors->max_nonzero_basic_dual = dVar34;
  primal_dual_errors->sum_nonzero_basic_duals = dVar34;
  primal_dual_errors->num_off_bound_nonbasic = iVar14;
  primal_dual_errors->max_off_bound_nonbasic = dVar34;
  primal_dual_errors->sum_off_bound_nonbasic = dVar34;
  if (bVar11 == false) {
    return;
  }
  primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200 = solution;
  local_1f0 = basis;
  local_140 = options;
  if (get_residuals) {
    absolute_primal_infeasibility = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&primal_positive_sum,(long)lp->num_row_,&absolute_primal_infeasibility);
    absolute_primal_infeasibility = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&primal_negative_sum,(long)lp->num_row_,&absolute_primal_infeasibility);
    if (local_200->dual_valid == true) {
      std::vector<double,_std::allocator<double>_>::resize(&dual_positive_sum,(long)lp->num_col_);
      std::vector<double,_std::allocator<double>_>::resize(&dual_negative_sum,(long)lp->num_col_);
    }
  }
  status = kNonbasic;
  bVar13 = local_1f0->valid;
  status_pointer = &status;
  if ((bool)bVar13 == false) {
    status_pointer = (HighsBasisStatus *)0x0;
  }
  local_140 = (HighsOptions *)&(local_140->super_HighsOptionsStruct).log_options;
  uVar32 = (ulong)(uint)lp->num_col_;
  lVar27 = 0;
  local_1e4 = 0;
  pdVar35 = (pointer)0x0;
  local_1b0 = highs_info;
  while( true ) {
    pHVar10 = local_1b0;
    pHVar9 = local_200;
    iVar14 = lp->num_row_;
    iVar31 = (int)uVar32;
    uVar15 = iVar14 + iVar31;
    lVar30 = (long)iVar31;
    if ((int)uVar15 <= lVar27) break;
    iVar14 = (int)lVar27;
    if (lVar27 < lVar30) {
      if (local_200->dual_valid == true) {
        pdVar35 = (pointer)(local_200->col_dual).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar27];
      }
      if ((bVar13 & 1) != 0) {
        status = (local_1f0->col_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
      }
      local_1b8 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar27];
      dVar34 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27];
      local_1d8 = (pointer)(local_200->col_value).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar27];
      if (pHVar4 != pHVar3) {
        pHVar5 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_1e4 = (undefined4)CONCAT71((int7)((ulong)pHVar5 >> 8),pHVar5[lVar27]);
      }
    }
    else {
      iVar16 = iVar14 - iVar31;
      if (local_200->dual_valid == true) {
        pdVar35 = (pointer)(local_200->row_dual).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar16];
      }
      local_1b8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar16];
      dVar34 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar16];
      local_1d8 = (pointer)(local_200->row_value).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar16];
      if ((bVar13 & 1) != 0) {
        status = (local_1f0->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar16];
      }
      local_1e4 = 0;
    }
    local_1a8 = (pointer)((double)lp->sense_ * (double)pdVar35);
    bVar11 = getVariableKktFailures
                       (local_1c0,local_1b8,local_1b8,dVar34,(double)local_1d8,(double)local_1a8,
                        status_pointer,(HighsVarType)local_1e4,&absolute_primal_infeasibility,
                        &relative_primal_infeasibility,&dual_infeasibility,&value_residual);
    if (!bVar11) {
      pcVar17 = "Row   ";
      if (lVar27 < lVar30) {
        pcVar17 = "Column";
        iVar31 = 0;
      }
      highsLogUser((HighsLogOptions *)local_140,kError,
                   "getKktFailures: %s %d status-value error: [%23.18g; %23.18g; %23.18g] has residual %g\n"
                   ,local_1b8,local_1d8,dVar34,pcVar17,(ulong)(uint)(iVar14 - iVar31));
    }
    if (local_1c0 < absolute_primal_infeasibility) {
      pHVar24 = &(local_1b0->super_HighsInfoStruct).num_primal_infeasibilities;
      *pHVar24 = *pHVar24 + 1;
    }
    if (*local_130 <= absolute_primal_infeasibility && absolute_primal_infeasibility != *local_130)
    {
      (primal_dual_errors->max_primal_infeasibility).absolute_index = iVar14;
      *local_130 = absolute_primal_infeasibility;
    }
    pdVar12 = &(primal_dual_errors->max_primal_infeasibility).relative_value;
    if (*pdVar12 <= relative_primal_infeasibility && relative_primal_infeasibility != *pdVar12) {
      (primal_dual_errors->max_primal_infeasibility).relative_index = iVar14;
      (primal_dual_errors->max_primal_infeasibility).relative_value = relative_primal_infeasibility;
    }
    (local_1b0->super_HighsInfoStruct).sum_primal_infeasibilities =
         absolute_primal_infeasibility +
         (local_1b0->super_HighsInfoStruct).sum_primal_infeasibilities;
    bVar11 = pHVar9->dual_valid;
    if (bVar11 == true) {
      if (local_138 < dual_infeasibility) {
        pHVar24 = &(local_1b0->super_HighsInfoStruct).num_dual_infeasibilities;
        *pHVar24 = *pHVar24 + 1;
      }
      if (*local_1e0 <= dual_infeasibility && dual_infeasibility != *local_1e0) {
        *local_1e0 = dual_infeasibility;
        (primal_dual_errors->max_dual_infeasibility).absolute_index = iVar14;
      }
      (local_1b0->super_HighsInfoStruct).sum_dual_infeasibilities =
           dual_infeasibility + (local_1b0->super_HighsInfoStruct).sum_dual_infeasibilities;
    }
    bVar13 = local_1f0->valid;
    if ((bool)bVar13 == true) {
      if (status == kBasic) {
        if (dual_infeasibility <= 0.0) goto LAB_0026f282;
        primal_dual_errors->num_nonzero_basic_duals =
             primal_dual_errors->num_nonzero_basic_duals + 1;
        pdVar12 = local_178;
        pdVar22 = local_180;
        pHVar24 = local_170;
        dVar34 = dual_infeasibility;
        if (local_138 < dual_infeasibility) goto LAB_0026f26c;
      }
      else {
        pdVar12 = local_160;
        pdVar22 = local_168;
        pHVar24 = local_158;
        dVar34 = value_residual;
        if (0.0 < value_residual) {
LAB_0026f26c:
          *pHVar24 = *pHVar24 + 1;
        }
      }
      dVar36 = *pdVar12;
      if (*pdVar12 <= dVar34) {
        dVar36 = dVar34;
      }
      *pdVar12 = dVar36;
      *pdVar22 = dVar34 + *pdVar22;
    }
LAB_0026f282:
    uVar32 = (ulong)lp->num_col_;
    if (lVar27 < (long)uVar32 && (byte)local_1f4 == '\0') {
      if (bVar11 != false) {
        dVar34 = (gradient->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        dVar36 = -dVar34;
        pvVar18 = &dual_negative_sum;
        if (dVar36 < dVar34) {
          pvVar18 = &dual_positive_sum;
        }
        if (dVar34 <= dVar36) {
          dVar34 = dVar36;
        }
        (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar27] = dVar34;
      }
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = piVar6[lVar27 + 1];
      pdVar35 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 = (local_200->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar30 = (long)piVar6[lVar27]; lVar30 < iVar14; lVar30 = lVar30 + 1) {
        iVar31 = piVar7[lVar30];
        dVar34 = pdVar35[lVar30];
        dVar36 = (double)local_1d8 * dVar34;
        if (dVar36 <= 0.0) {
          primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar31] =
               primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar31] - dVar36;
        }
        else {
          primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar31] =
               dVar36 + primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar31];
        }
        if (bVar11 != false) {
          dVar34 = dVar34 * -pdVar8[iVar31];
          if (dVar34 <= 0.0) {
            dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] =
                 dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27] - dVar34;
          }
          else {
            dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] =
                 dVar34 + dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar27];
          }
        }
      }
    }
    lVar27 = lVar27 + 1;
    pdVar35 = local_1a8;
  }
  cVar20 = local_200->dual_valid;
  if ((bool)cVar20 != false) {
    local_1b8 = (double)CONCAT71(local_1b8._1_7_,cVar20);
    (highs_info->super_HighsInfoStruct).max_complementarity_violation = 0.0;
    (highs_info->super_HighsInfoStruct).sum_complementarity_violations = 0.0;
    local_1d8 = (local_200->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1a8 = (local_200->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1f0 = (HighsBasis *)
                (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    pdVar35 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (local_200->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar22 = (local_200->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar21 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar23 = 0;
    uVar32 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar32 = uVar23;
    }
    pdVar19 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar34 = 0.0;
    dVar36 = 0.0;
    for (; uVar32 != uVar23; uVar23 = uVar23 + 1) {
      lVar27 = uVar23 - lVar30;
      pdVar25 = pdVar12;
      pdVar26 = pdVar21;
      pdVar28 = pdVar22;
      pdVar33 = pdVar19;
      if (lVar30 <= (long)uVar23) {
        pdVar25 = local_1d8 + lVar27;
        pdVar28 = local_1a8 + lVar27;
        pdVar26 = (double *)((long)local_1f0 + lVar27 * 8);
        pdVar33 = pdVar35 + lVar27;
      }
      dVar37 = *pdVar25;
      dVar1 = *pdVar26;
      dVar2 = *pdVar33;
      if ((-INFINITY < dVar1) || (dVar38 = 1.0, dVar2 < INFINITY)) {
        if ((dVar1 + dVar2) * 0.5 <= dVar37) {
          dVar38 = ABS(dVar2 - dVar37);
        }
        else {
          dVar38 = ABS(dVar1 - dVar37);
        }
      }
      dVar38 = ABS(*pdVar28) * dVar38;
      dVar36 = dVar36 + dVar38;
      (local_1b0->super_HighsInfoStruct).sum_complementarity_violations = dVar36;
      if (dVar34 <= dVar38) {
        dVar34 = dVar38;
      }
      (local_1b0->super_HighsInfoStruct).max_complementarity_violation = dVar34;
      pdVar19 = pdVar19 + 1;
      pdVar21 = pdVar21 + 1;
      pdVar22 = pdVar22 + 1;
      pdVar12 = pdVar12 + 1;
    }
    getComplementarityViolations
              (lp,local_200,&check_max_complementarity_violation,
               &check_sum_complementarity_violations);
    cVar20 = local_1b8._0_1_;
  }
  if (get_residuals) {
    pdVar35 = (local_200->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar27 = 0; lVar27 < iVar14; lVar27 = lVar27 + 1) {
      dVar34 = pdVar35[lVar27];
      if (0.0 <= dVar34) {
        dVar36 = dVar34 + primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar27];
        primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = dVar36;
        dVar34 = primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
      }
      else {
        dVar34 = primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27] - dVar34;
        primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = dVar34;
        dVar36 = primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
      }
      dVar37 = ABS(dVar34 - dVar36);
      if (1e-12 < dVar37) {
        *local_1c8 = *local_1c8 + 1;
      }
      if (local_1d0->absolute_value <= dVar37 && dVar37 != local_1d0->absolute_value) {
        local_1d0->absolute_value = dVar37;
        (primal_dual_errors->max_primal_residual).absolute_index = (HighsInt)lVar27;
      }
      dVar34 = dVar37 / (dVar34 + 1.0 + dVar36);
      if (*local_148 <= dVar34 && dVar34 != *local_148) {
        *local_148 = dVar34;
        (primal_dual_errors->max_primal_residual).relative_index = (HighsInt)lVar27;
      }
      primal_dual_errors->sum_primal_residual = primal_dual_errors->sum_primal_residual + dVar37;
      iVar14 = lp->num_row_;
    }
    if (cVar20 == '\0') {
      (pHVar10->super_HighsInfoStruct).primal_solution_status =
           ((pHVar10->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
      goto LAB_0026f75e;
    }
    pdVar35 = (local_200->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar27 = 0; lVar27 < lp->num_col_; lVar27 = lVar27 + 1) {
      dVar34 = pdVar35[lVar27];
      if (0.0 <= dVar34) {
        dVar36 = dVar34 + dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar27];
        dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = dVar36;
        dVar34 = dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
      }
      else {
        dVar34 = dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27] - dVar34;
        dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = dVar34;
        dVar36 = dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
      }
      dVar37 = ABS(dVar34 - dVar36);
      if (1e-12 < dVar37) {
        primal_dual_errors->num_dual_residual = primal_dual_errors->num_dual_residual + 1;
      }
      if (pHVar29->absolute_value <= dVar37 && dVar37 != pHVar29->absolute_value) {
        pHVar29->absolute_value = dVar37;
        *local_188 = (HighsInt)lVar27;
      }
      dVar34 = dVar37 / (dVar34 + 1.0 + dVar36);
      if (*local_198 <= dVar34 && dVar34 != *local_198) {
        *local_198 = dVar34;
        *local_190 = (HighsInt)lVar27;
      }
      *local_150 = *local_150 + dVar37;
    }
  }
  (pHVar10->super_HighsInfoStruct).primal_solution_status =
       ((pHVar10->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
  if (cVar20 != '\0') {
    if ((pHVar10->super_HighsInfoStruct).num_dual_infeasibilities == 0) {
      (pHVar10->super_HighsInfoStruct).dual_solution_status = 2;
    }
    else {
      (pHVar10->super_HighsInfoStruct).dual_solution_status = 1;
    }
  }
LAB_0026f75e:
  (primal_dual_errors->max_primal_infeasibility).absolute_value = *local_130;
  dVar34 = *local_1e0;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = dVar34;
  (primal_dual_errors->max_dual_infeasibility).relative_value = dVar34;
  (primal_dual_errors->max_dual_infeasibility).relative_index =
       (primal_dual_errors->max_dual_infeasibility).absolute_index;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dual_negative_sum.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dual_positive_sum.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&primal_negative_sum.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&primal_positive_sum.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void getKktFailures(const HighsOptions& options, const HighsLp& lp,
                    const std::vector<double>& gradient,
                    const HighsSolution& solution, const HighsBasis& basis,
                    HighsInfo& highs_info,
                    HighsPrimalDualErrors& primal_dual_errors,
                    const bool get_residuals) {
  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  // highs_info are the values computed in this method.

  HighsInt& num_primal_infeasibility = highs_info.num_primal_infeasibilities;

  HighsInt& max_absolute_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.absolute_index;
  double& max_absolute_primal_infeasibility_value =
      highs_info.max_primal_infeasibility;
  HighsInt& max_relative_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.relative_index;
  double& max_relative_primal_infeasibility_value =
      primal_dual_errors.max_primal_infeasibility.relative_value;

  double& sum_primal_infeasibility = highs_info.sum_primal_infeasibilities;

  HighsInt& num_dual_infeasibility = highs_info.num_dual_infeasibilities;

  HighsInt& max_dual_infeasibility_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
  double& max_dual_infeasibility_value = highs_info.max_dual_infeasibility;

  double& sum_dual_infeasibility = highs_info.sum_dual_infeasibilities;

  double& max_complementarity_violation =
      highs_info.max_complementarity_violation;
  double& sum_complementarity_violations =
      highs_info.sum_complementarity_violations;

  num_primal_infeasibility = kHighsIllegalInfeasibilityCount;
  max_absolute_primal_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  primal_dual_errors.max_primal_infeasibility.invalidate();
  highs_info.primal_solution_status = kSolutionStatusNone;

  num_dual_infeasibility = kHighsIllegalInfeasibilityCount;
  max_dual_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;

  primal_dual_errors.max_dual_infeasibility.invalidate();
  highs_info.dual_solution_status = kSolutionStatusNone;

  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;

  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  const bool& have_basis = basis.valid;
  const bool have_integrality = (lp.integrality_.size() != 0);
  // Check that there is no dual solution if there's no primal solution
  assert(have_primal_solution || !have_dual_solution);
  // Check that there is no basis if there's no dual solution
  assert(have_dual_solution || !have_basis);

  if (have_primal_solution) {
    // There's a primal solution, so check its size and initialise the
    // infeasibility counts
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    num_primal_infeasibility = 0;
    max_absolute_primal_infeasibility_value = 0;
    sum_primal_infeasibility = 0;
    primal_dual_errors.max_primal_infeasibility.reset();
    if (have_dual_solution) {
      // There's a dual solution, so check its size and initialise the
      // infeasibility counts
      assert((int)solution.col_dual.size() >= lp.num_col_);
      assert((int)solution.row_dual.size() >= lp.num_row_);
      num_dual_infeasibility = 0;
      max_dual_infeasibility_value = 0;
      sum_dual_infeasibility = 0;
      primal_dual_errors.max_dual_infeasibility.reset();
    }
  }

  HighsInt& num_primal_residual = primal_dual_errors.num_primal_residual;

  HighsInt& max_absolute_primal_residual_index =
      primal_dual_errors.max_primal_residual.absolute_index;
  double& max_absolute_primal_residual_value =
      primal_dual_errors.max_primal_residual.absolute_value;
  HighsInt& max_relative_primal_residual_index =
      primal_dual_errors.max_primal_residual.relative_index;
  double& max_relative_primal_residual_value =
      primal_dual_errors.max_primal_residual.relative_value;

  double& sum_primal_residual = primal_dual_errors.sum_primal_residual;

  HighsInt& num_dual_residual = primal_dual_errors.num_dual_residual;

  HighsInt& max_absolute_dual_residual_index =
      primal_dual_errors.max_dual_residual.absolute_index;
  double& max_absolute_dual_residual_value =
      primal_dual_errors.max_dual_residual.absolute_value;
  HighsInt& max_relative_dual_residual_index =
      primal_dual_errors.max_dual_residual.relative_index;
  double& max_relative_dual_residual_value =
      primal_dual_errors.max_dual_residual.relative_value;

  double& sum_dual_residual = primal_dual_errors.sum_dual_residual;

  HighsInt& num_nonzero_basic_duals =
      primal_dual_errors.num_nonzero_basic_duals;
  HighsInt& num_large_nonzero_basic_duals =
      primal_dual_errors.num_large_nonzero_basic_duals;
  double& max_nonzero_basic_dual = primal_dual_errors.max_nonzero_basic_dual;
  double& sum_nonzero_basic_duals = primal_dual_errors.sum_nonzero_basic_duals;

  HighsInt& num_off_bound_nonbasic = primal_dual_errors.num_off_bound_nonbasic;
  double& max_off_bound_nonbasic = primal_dual_errors.max_off_bound_nonbasic;
  double& sum_off_bound_nonbasic = primal_dual_errors.sum_off_bound_nonbasic;

  // Initialise HighsPrimalDualErrors

  if (have_primal_solution && get_residuals) {
    num_primal_residual = 0;
    max_absolute_primal_residual_value = 0;
    sum_primal_residual = 0;
    primal_dual_errors.max_primal_residual.reset();
  } else {
    num_primal_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_primal_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_primal_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_primal_residual.invalidate();
  }
  if (have_dual_solution && get_residuals) {
    num_dual_residual = 0;
    max_absolute_dual_residual_value = 0;
    sum_dual_residual = 0;
    primal_dual_errors.max_dual_residual.reset();
  } else {
    num_dual_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_dual_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_dual_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_dual_residual.invalidate();
  }
  if (have_basis) {
    num_nonzero_basic_duals = 0;
    num_large_nonzero_basic_duals = 0;
    max_nonzero_basic_dual = 0;
    sum_nonzero_basic_duals = 0;

    num_off_bound_nonbasic = 0;
    max_off_bound_nonbasic = 0;
    sum_off_bound_nonbasic = 0;
  } else {
    num_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    num_large_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    max_nonzero_basic_dual = kHighsIllegalInfeasibilityMeasure;
    sum_nonzero_basic_duals = kHighsIllegalInfeasibilityMeasure;

    num_off_bound_nonbasic = kHighsIllegalInfeasibilityCount;
    max_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
    sum_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
  }

  // Without a primal solution, nothing can be done!
  if (!have_primal_solution) return;
  std::vector<double> primal_positive_sum;
  std::vector<double> primal_negative_sum;
  std::vector<double> dual_positive_sum;
  std::vector<double> dual_negative_sum;
  if (get_residuals) {
    primal_positive_sum.assign(lp.num_row_, 0);
    primal_negative_sum.assign(lp.num_row_, 0);
    if (have_dual_solution) {
      dual_positive_sum.resize(lp.num_col_);
      dual_negative_sum.resize(lp.num_col_);
    }
  }

  // Set status to a value so the compiler doesn't think it might be unassigned.
  HighsBasisStatus status = HighsBasisStatus::kNonbasic;
  // Set status_pointer to be NULL unless we have a basis, in which
  // case it's the pointer to status. Can't make it a pointer to the
  // entry of basis since this is const.
  const HighsBasisStatus* status_pointer = have_basis ? &status : NULL;

  double absolute_primal_infeasibility;
  double relative_primal_infeasibility;
  double dual_infeasibility;
  double value_residual;
  double lower;
  double upper;
  double value;
  double dual = 0;
  HighsVarType integrality = HighsVarType::kContinuous;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    if (iVar < lp.num_col_) {
      HighsInt iCol = iVar;
      lower = lp.col_lower_[iCol];
      upper = lp.col_upper_[iCol];
      value = solution.col_value[iCol];
      if (have_dual_solution) dual = solution.col_dual[iCol];
      if (have_basis) status = basis.col_status[iCol];
      if (have_integrality) integrality = lp.integrality_[iCol];
    } else {
      HighsInt iRow = iVar - lp.num_col_;
      lower = lp.row_lower_[iRow];
      upper = lp.row_upper_[iRow];
      value = solution.row_value[iRow];
      // @FlipRowDual -solution.row_dual[iRow]; became solution.row_dual[iRow];
      if (have_dual_solution) dual = solution.row_dual[iRow];
      if (have_basis) status = basis.row_status[iRow];
      integrality = HighsVarType::kContinuous;
    }
    // Flip dual according to lp.sense_
    dual *= (HighsInt)lp.sense_;

    const bool status_value_ok = getVariableKktFailures(
        primal_feasibility_tolerance, dual_feasibility_tolerance, lower, upper,
        value, dual, status_pointer, integrality, absolute_primal_infeasibility,
        relative_primal_infeasibility, dual_infeasibility, value_residual);
    if (!status_value_ok)
      highsLogUser(options.log_options, HighsLogType::kError,
                   "getKktFailures: %s %d status-value error: [%23.18g; "
                   "%23.18g; %23.18g] has "
                   "residual %g\n",
                   iVar < lp.num_col_ ? "Column" : "Row   ",
                   iVar < lp.num_col_ ? int(iVar) : int(iVar - lp.num_col_),
                   lower, value, upper, value_residual);
    assert(status_value_ok);
    // Accumulate primal infeasibilities
    if (absolute_primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    if (max_absolute_primal_infeasibility_value <
        absolute_primal_infeasibility) {
      max_absolute_primal_infeasibility_index = iVar;
      max_absolute_primal_infeasibility_value = absolute_primal_infeasibility;
    }
    if (max_relative_primal_infeasibility_value <
        relative_primal_infeasibility) {
      max_relative_primal_infeasibility_index = iVar;
      max_relative_primal_infeasibility_value = relative_primal_infeasibility;
    }
    sum_primal_infeasibility += absolute_primal_infeasibility;

    if (have_dual_solution) {
      // Accumulate dual infeasibilities
      if (dual_infeasibility > dual_feasibility_tolerance)
        num_dual_infeasibility++;
      if (max_dual_infeasibility_value < dual_infeasibility) {
        max_dual_infeasibility_value = dual_infeasibility;
        max_dual_infeasibility_index = iVar;
      }
      sum_dual_infeasibility += dual_infeasibility;
    }
    if (have_basis) {
      if (status == HighsBasisStatus::kBasic) {
        double abs_basic_dual = dual_infeasibility;
        if (abs_basic_dual > 0) {
          num_nonzero_basic_duals++;
          if (abs_basic_dual > dual_feasibility_tolerance)
            num_large_nonzero_basic_duals++;
          max_nonzero_basic_dual =
              std::max(abs_basic_dual, max_nonzero_basic_dual);
          sum_nonzero_basic_duals += abs_basic_dual;
        }
      } else {
        double off_bound_nonbasic = value_residual;
        if (off_bound_nonbasic > 0) num_off_bound_nonbasic++;
        max_off_bound_nonbasic =
            std::max(off_bound_nonbasic, max_off_bound_nonbasic);
        sum_off_bound_nonbasic += off_bound_nonbasic;
      }
    }
    if (iVar < lp.num_col_ && get_residuals) {
      HighsInt iCol = iVar;
      if (have_dual_solution) {
        if (gradient[iCol] > 0) {
          dual_positive_sum[iCol] = gradient[iCol];
        } else {
          dual_negative_sum[iCol] = -gradient[iCol];
        }
      }
      for (HighsInt el = lp.a_matrix_.start_[iCol];
           el < lp.a_matrix_.start_[iCol + 1]; el++) {
        HighsInt iRow = lp.a_matrix_.index_[el];
        double Avalue = lp.a_matrix_.value_[el];
        double term = value * Avalue;
        if (term > 0) {
          primal_positive_sum[iRow] += term;
        } else {
          primal_negative_sum[iRow] -= term;
        }
        // @FlipRowDual += became -=
        if (have_dual_solution) {
          double term = -solution.row_dual[iRow] * Avalue;
          if (term > 0) {
            dual_positive_sum[iCol] += term;
          } else {
            dual_negative_sum[iCol] -= term;
          }
        }
      }
    }
  }

  if (have_dual_solution) {
    // Determine the sum of complementarity violations
    max_complementarity_violation = 0;
    sum_complementarity_violations = 0;
    double primal_residual = 0;
    for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
      const bool is_col = iVar < lp.num_col_;
      const HighsInt iRow = iVar - lp.num_col_;
      const double primal =
          is_col ? solution.col_value[iVar] : solution.row_value[iRow];
      const double dual =
          is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
      const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
      const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
      if (lower <= -kHighsInf && upper >= kHighsInf) {
        // Free
        primal_residual = 1;
      } else {
        const double mid = (lower + upper) * 0.5;
        primal_residual = primal < mid ? std::fabs(lower - primal)
                                       : std::fabs(upper - primal);
      }
      const double dual_residual = std::fabs(dual);
      const double complementarity_violation = primal_residual * dual_residual;
      sum_complementarity_violations += complementarity_violation;
      max_complementarity_violation =
          std::max(complementarity_violation, max_complementarity_violation);
    }
    double check_max_complementarity_violation;
    double check_sum_complementarity_violations;
    const bool have_values = getComplementarityViolations(
        lp, solution, check_max_complementarity_violation,
        check_sum_complementarity_violations);
    assert(have_values);
    assert(check_max_complementarity_violation ==
           max_complementarity_violation);
    assert(check_sum_complementarity_violations ==
           sum_complementarity_violations);
  }

  if (get_residuals) {
    const double large_residual_error = 1e-12;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double term = -solution.row_value[iRow];
      if (term > 0) {
        primal_positive_sum[iRow] += term;
      } else {
        primal_negative_sum[iRow] -= term;
      }
      assert(primal_positive_sum[iRow] >= 0);
      assert(primal_negative_sum[iRow] >= 0);
      double absolute_primal_residual =
          std::fabs(primal_positive_sum[iRow] - primal_negative_sum[iRow]);
      double relative_primal_residual =
          absolute_primal_residual /
          (1 + primal_positive_sum[iRow] + primal_negative_sum[iRow]);

      if (absolute_primal_residual > large_residual_error)
        num_primal_residual++;
      if (max_absolute_primal_residual_value < absolute_primal_residual) {
        max_absolute_primal_residual_value = absolute_primal_residual;
        max_absolute_primal_residual_index = iRow;
      }
      if (max_relative_primal_residual_value < relative_primal_residual) {
        max_relative_primal_residual_value = relative_primal_residual;
        max_relative_primal_residual_index = iRow;
      }
      sum_primal_residual += absolute_primal_residual;
    }
    if (have_dual_solution) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        double term = -solution.col_dual[iCol];
        if (term > 0) {
          dual_positive_sum[iCol] += term;
        } else {
          dual_negative_sum[iCol] -= term;
        }
        assert(dual_positive_sum[iCol] >= 0);
        assert(dual_negative_sum[iCol] >= 0);
        double absolute_dual_residual =
            std::fabs(dual_positive_sum[iCol] - dual_negative_sum[iCol]);
        double relative_dual_residual =
            absolute_dual_residual /
            (1 + dual_positive_sum[iCol] + dual_negative_sum[iCol]);
        if (absolute_dual_residual > large_residual_error) num_dual_residual++;
        if (max_absolute_dual_residual_value < absolute_dual_residual) {
          max_absolute_dual_residual_value = absolute_dual_residual;
          max_absolute_dual_residual_index = iCol;
        }
        if (max_relative_dual_residual_value < relative_dual_residual) {
          max_relative_dual_residual_value = relative_dual_residual;
          max_relative_dual_residual_index = iCol;
        }
        sum_dual_residual += absolute_dual_residual;
      }
    }
  }
  // Assign primal solution status
  if (num_primal_infeasibility) {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  }
  if (have_dual_solution) {
    // Assign dual solution status
    if (num_dual_infeasibility) {
      highs_info.dual_solution_status = kSolutionStatusInfeasible;
    } else {
      highs_info.dual_solution_status = kSolutionStatusFeasible;
    }
  }
  // Assign the two entries in primal_dual_errors that are accumulated
  // in highs_info
  primal_dual_errors.max_primal_infeasibility.absolute_value =
      highs_info.max_primal_infeasibility;
  ;
  primal_dual_errors.max_dual_infeasibility.absolute_value =
      highs_info.max_dual_infeasibility;
  // Relative dual_infeasibility data is the same as absolute
  primal_dual_errors.max_dual_infeasibility.relative_value =
      primal_dual_errors.max_dual_infeasibility.absolute_value;
  primal_dual_errors.max_dual_infeasibility.relative_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
}